

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satInterP.c
# Opt level: O1

int Intp_ManProofRecordOne(Intp_Man_t *p,Sto_Cls_t *pClause)

{
  long lVar1;
  uint uVar2;
  Sto_Cls_t *pSVar3;
  undefined8 *puVar4;
  void **ppvVar5;
  uint uVar6;
  int iVar7;
  long lVar8;
  int iVar9;
  ulong uVar10;
  Sto_Cls_t *pFinal;
  int iVar11;
  ulong uVar12;
  Vec_Ptr_t *pVVar13;
  
  uVar2 = *(uint *)&pClause->field_0x1c;
  if ((uVar2 & 0x7fffff8) == 0) {
    __assert_fail("pClause->nLits > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satInterP.c"
                  ,0x2a2,"int Intp_ManProofRecordOne(Intp_Man_t *, Sto_Cls_t *)");
  }
  if ((uVar2 & 2) != 0) {
    __assert_fail("!pClause->fRoot",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satInterP.c"
                  ,0x2a6,"int Intp_ManProofRecordOne(Intp_Man_t *, Sto_Cls_t *)");
  }
  if (p->nTrailSize != p->nRootSize) {
    __assert_fail("p->nTrailSize == p->nRootSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satInterP.c"
                  ,0x2a7,"int Intp_ManProofRecordOne(Intp_Man_t *, Sto_Cls_t *)");
  }
  uVar2 = uVar2 >> 3 & 0xffffff;
  if (uVar2 != 0) {
    uVar10 = 0;
    do {
      iVar9 = *(int *)((long)&pClause[1].pNext + uVar10 * 4);
      if (p->pAssigns[iVar9 >> 1] == iVar9) goto LAB_008d61a1;
      uVar10 = uVar10 + 1;
    } while (uVar2 != uVar10);
  }
  if ((*(uint *)&pClause->field_0x1c & 0x7fffff8) != 0) {
    uVar10 = 0;
    do {
      uVar2 = *(uint *)((long)&pClause[1].pNext + uVar10 * 4);
      uVar6 = uVar2 ^ 1;
      iVar9 = (int)uVar2 >> 1;
      uVar2 = p->pAssigns[iVar9];
      if (uVar2 == 0xffffffff) {
        p->pAssigns[iVar9] = uVar6;
        p->pReasons[iVar9] = (Sto_Cls_t *)0x0;
        iVar9 = p->nTrailSize;
        p->nTrailSize = iVar9 + 1;
        p->pTrail[iVar9] = uVar6;
      }
      else if (uVar2 != uVar6) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satInterP.c"
                      ,0x2b7,"int Intp_ManProofRecordOne(Intp_Man_t *, Sto_Cls_t *)");
      }
      uVar10 = uVar10 + 1;
    } while (uVar10 < (*(uint *)&pClause->field_0x1c >> 3 & 0xffffff));
  }
  pSVar3 = Intp_ManPropagate(p,p->nRootSize);
  if (pSVar3 == (Sto_Cls_t *)0x0) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satInterP.c"
                  ,0x2bf,"int Intp_ManProofRecordOne(Intp_Man_t *, Sto_Cls_t *)");
  }
  uVar6 = *(uint *)&pClause->field_0x1c >> 3 & 0xffffff;
  uVar2 = *(uint *)&pSVar3->field_0x1c >> 3 & 0xffffff;
  if (uVar2 <= uVar6) {
    uVar10 = 0;
    if (uVar2 != 0) {
      do {
        uVar12 = 0;
        if (uVar6 != 0) {
          uVar12 = 0;
          do {
            if (*(int *)((long)&pSVar3[1].pNext + uVar10 * 4) ==
                *(int *)((long)&pClause[1].pNext + uVar12 * 4)) goto LAB_008d614e;
            uVar12 = uVar12 + 1;
          } while (uVar6 != uVar12);
          uVar12 = (ulong)uVar6;
        }
LAB_008d614e:
        if ((uint)uVar12 == uVar6) goto LAB_008d615c;
        uVar10 = uVar10 + 1;
      } while (uVar10 != uVar2);
      uVar10 = (ulong)uVar2;
    }
LAB_008d615c:
    if ((uint)uVar10 == uVar2) {
      iVar9 = p->nRootSize;
      lVar8 = (long)p->nTrailSize;
      if (iVar9 < p->nTrailSize) {
        do {
          lVar1 = lVar8 + -1;
          lVar8 = lVar8 + -1;
          iVar11 = p->pTrail[lVar1] >> 1;
          p->pReasons[iVar11] = (Sto_Cls_t *)0x0;
          p->pAssigns[iVar11] = -1;
        } while (iVar9 < lVar8);
      }
      p->nTrailSize = iVar9;
LAB_008d61a1:
      pVVar13 = p->vAntClas;
      puVar4 = (undefined8 *)malloc(0x10);
      *puVar4 = 0;
      puVar4[1] = 0;
      uVar2 = pVVar13->nCap;
      if (pVVar13->nSize == uVar2) {
        if ((int)uVar2 < 0x10) {
          if (pVVar13->pArray == (void **)0x0) {
            ppvVar5 = (void **)malloc(0x80);
          }
          else {
            ppvVar5 = (void **)realloc(pVVar13->pArray,0x80);
          }
          pVVar13->pArray = ppvVar5;
          iVar9 = 0x10;
        }
        else {
          iVar9 = uVar2 * 2;
          if (iVar9 <= (int)uVar2) goto LAB_008d647f;
          if (pVVar13->pArray == (void **)0x0) {
            ppvVar5 = (void **)malloc((ulong)uVar2 << 4);
          }
          else {
            ppvVar5 = (void **)realloc(pVVar13->pArray,(ulong)uVar2 << 4);
          }
          pVVar13->pArray = ppvVar5;
        }
        pVVar13->nCap = iVar9;
      }
LAB_008d647f:
      iVar9 = pVVar13->nSize;
      pVVar13->nSize = iVar9 + 1;
      pVVar13->pArray[iVar9] = puVar4;
      return 1;
    }
  }
  Intp_ManProofTraceOne(p,pSVar3,pClause);
  iVar9 = p->nRootSize;
  lVar8 = (long)p->nTrailSize;
  if (iVar9 < p->nTrailSize) {
    do {
      lVar1 = lVar8 + -1;
      lVar8 = lVar8 + -1;
      iVar11 = p->pTrail[lVar1] >> 1;
      p->pReasons[iVar11] = (Sto_Cls_t *)0x0;
      p->pAssigns[iVar11] = -1;
    } while (iVar9 < lVar8);
  }
  p->nTrailSize = iVar9;
  uVar2 = *(uint *)&pClause->field_0x1c >> 3 & 0xffffff;
  if (1 < uVar2) {
    uVar2 = *(uint *)&pClause[1].pNext;
    if ((-1 < (int)uVar2) && ((int)uVar2 >> 1 < p->pCnf->nVars)) {
      pClause->pNext0 = p->pWatches[(ulong)uVar2 ^ 1];
      p->pWatches[(ulong)uVar2 ^ 1] = pClause;
      uVar6 = *(uint *)((long)&pClause[1].pNext + 4);
      if ((-1 < (int)uVar6) && ((int)uVar6 >> 1 < p->pCnf->nVars)) {
        (&pClause->pNext0)[uVar2 != uVar6] = p->pWatches[(ulong)uVar6 ^ 1];
        p->pWatches[uVar6 ^ 1] = pClause;
        return 1;
      }
    }
    __assert_fail("lit_check(Lit, p->pCnf->nVars)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satInterP.c"
                  ,0x115,"void Intp_ManWatchClause(Intp_Man_t *, Sto_Cls_t *, lit)");
  }
  if (uVar2 != 1) {
    __assert_fail("pClause->nLits == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satInterP.c"
                  ,0x2e7,"int Intp_ManProofRecordOne(Intp_Man_t *, Sto_Cls_t *)");
  }
  iVar9 = *(int *)&pClause[1].pNext;
  iVar7 = iVar9 >> 1;
  iVar11 = p->pAssigns[iVar7];
  if (iVar11 == -1) {
    p->pAssigns[iVar7] = iVar9;
    p->pReasons[iVar7] = pClause;
    iVar11 = p->nTrailSize;
    p->nTrailSize = iVar11 + 1;
    p->pTrail[iVar11] = iVar9;
  }
  else if (iVar11 != iVar9) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satInterP.c"
                  ,0x2ec,"int Intp_ManProofRecordOne(Intp_Man_t *, Sto_Cls_t *)");
  }
  pSVar3 = Intp_ManPropagate(p,p->nRootSize);
  if (pSVar3 == (Sto_Cls_t *)0x0) {
    p->nRootSize = p->nTrailSize;
    return 1;
  }
  pVVar13 = p->vAntClas;
  uVar2 = pVVar13->nSize;
  pFinal = p->pCnf->pEmpty;
  if ((int)uVar2 < pFinal->Id - p->nAntStart) {
    do {
      puVar4 = (undefined8 *)malloc(0x10);
      *puVar4 = 0;
      puVar4[1] = 0;
      uVar6 = pVVar13->nCap;
      if (uVar2 == uVar6) {
        if ((int)uVar6 < 0x10) {
          if (pVVar13->pArray == (void **)0x0) {
            ppvVar5 = (void **)malloc(0x80);
          }
          else {
            ppvVar5 = (void **)realloc(pVVar13->pArray,0x80);
          }
          pVVar13->pArray = ppvVar5;
          iVar9 = 0x10;
        }
        else {
          iVar9 = uVar6 * 2;
          if (iVar9 <= (int)uVar6) goto LAB_008d640a;
          if (pVVar13->pArray == (void **)0x0) {
            ppvVar5 = (void **)malloc((ulong)uVar6 << 4);
          }
          else {
            ppvVar5 = (void **)realloc(pVVar13->pArray,(ulong)uVar6 << 4);
          }
          pVVar13->pArray = ppvVar5;
        }
        pVVar13->nCap = iVar9;
      }
LAB_008d640a:
      iVar9 = pVVar13->nSize;
      pVVar13->nSize = iVar9 + 1;
      pVVar13->pArray[iVar9] = puVar4;
      pVVar13 = p->vAntClas;
      uVar2 = pVVar13->nSize;
      pFinal = p->pCnf->pEmpty;
    } while ((int)uVar2 < pFinal->Id - p->nAntStart);
  }
  Intp_ManProofTraceOne(p,pSVar3,pFinal);
  return 0;
}

Assistant:

int Intp_ManProofRecordOne( Intp_Man_t * p, Sto_Cls_t * pClause )
{
    Sto_Cls_t * pConflict;
    int i;

    // empty clause never ends up there
    assert( pClause->nLits > 0 );
    if ( pClause->nLits == 0 )
        printf( "Error: Empty clause is attempted.\n" );

    assert( !pClause->fRoot );
    assert( p->nTrailSize == p->nRootSize );

    // if any of the clause literals are already assumed
    // it means that the clause is redundant and can be skipped
    for ( i = 0; i < (int)pClause->nLits; i++ )
        if ( p->pAssigns[lit_var(pClause->pLits[i])] == pClause->pLits[i] )
        {
//            Vec_IntPush( p->vBreaks, Vec_IntSize(p->vAnties) );
            Vec_PtrPush( p->vAntClas, Vec_IntAlloc(0) );
            return 1;
        }

    // add assumptions to the trail
    for ( i = 0; i < (int)pClause->nLits; i++ )
        if ( !Intp_ManEnqueue( p, lit_neg(pClause->pLits[i]), NULL ) )
        {
            assert( 0 ); // impossible
            return 0;
        }

    // propagate the assumptions
    pConflict = Intp_ManPropagate( p, p->nRootSize );
    if ( pConflict == NULL )
    {
        assert( 0 ); // cannot prove
        return 0;
    }

    // skip the clause if it is weaker or the same as the conflict clause
    if ( pClause->nLits >= pConflict->nLits )
    {
        // check if every literal of conflict clause can be found in the given clause
        int j;
        for ( i = 0; i < (int)pConflict->nLits; i++ )
        {
            for ( j = 0; j < (int)pClause->nLits; j++ )
                if ( pConflict->pLits[i] == pClause->pLits[j] )
                    break;
            if ( j == (int)pClause->nLits ) // literal pConflict->pLits[i] is not found
                break;
        }
        if ( i == (int)pConflict->nLits ) // all lits are found
        {
            // undo to the root level
            Intp_ManCancelUntil( p, p->nRootSize );
//            Vec_IntPush( p->vBreaks, Vec_IntSize(p->vAnties) );
            Vec_PtrPush( p->vAntClas, Vec_IntAlloc(0) );
            return 1;
        }
    }

    // construct the proof
    Intp_ManProofTraceOne( p, pConflict, pClause );

    // undo to the root level
    Intp_ManCancelUntil( p, p->nRootSize );

    // add large clauses to the watched lists
    if ( pClause->nLits > 1 )
    {
        Intp_ManWatchClause( p, pClause, pClause->pLits[0] );
        Intp_ManWatchClause( p, pClause, pClause->pLits[1] );
        return 1;
    }
    assert( pClause->nLits == 1 );

    // if the clause proved is unit, add it and propagate
    if ( !Intp_ManEnqueue( p, pClause->pLits[0], pClause ) )
    {
        assert( 0 ); // impossible
        return 0;
    }

    // propagate the assumption
    pConflict = Intp_ManPropagate( p, p->nRootSize );
    if ( pConflict )
    {
        // insert place-holders till the empty clause
        while ( Vec_PtrSize(p->vAntClas) < p->pCnf->pEmpty->Id - p->nAntStart )
            Vec_PtrPush( p->vAntClas, Vec_IntAlloc(0) );
        // construct the proof for the empty clause
        Intp_ManProofTraceOne( p, pConflict, p->pCnf->pEmpty );
//        if ( p->fVerbose )
//            printf( "Found last conflict after adding unit clause number %d!\n", pClause->Id );
        return 0;
    }

    // update the root level
    p->nRootSize = p->nTrailSize;
    return 1;
}